

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

Error asmjit::Logging::formatRegister
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                uint32_t regType,uint32_t regId)

{
  char *pcVar1;
  char *str;
  char cVar2;
  Error in_EAX;
  Error EVar3;
  long lVar4;
  ulong uVar5;
  uint uVar7;
  uint32_t advance;
  ulong uVar8;
  uint32_t uVar9;
  CodeEmitter *emitter_00;
  undefined1 *puVar10;
  uint uVar11;
  Operand_ *unaff_RBX;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint32_t count;
  long unaff_R12;
  char *pcVar15;
  uint unaff_R13D;
  Operand_ *op;
  char *pcVar16;
  ulong uVar17;
  bool bVar18;
  ulong uVar6;
  
  uVar6 = (ulong)regId;
  uVar17 = (ulong)regId;
  uVar12 = (ulong)regType;
  if (regId < 0x100) {
    pcVar16 = "PhysReg<Type=%u Id=%u>";
    if (regType < 0x20) {
      if (regId < (byte)x86RegFormatInfo[uVar12 * 4 + 3]) {
        regType = StringBuilder::_opString
                            (sb,1,x86RegFormatStrings +
                                  uVar17 * 4 + (ulong)(byte)x86RegFormatInfo[uVar12 * 4 + 2],
                             0xffffffffffffffff);
        bVar18 = false;
      }
      else if (regId < (byte)x86RegFormatInfo[uVar12 * 4]) {
        bVar18 = false;
        regType = StringBuilder::appendFormat
                            (sb,x86RegFormatStrings + (byte)x86RegFormatInfo[uVar12 * 4 + 1],uVar17)
        ;
      }
      else {
        bVar18 = true;
      }
      if (!bVar18) {
        return regType;
      }
    }
    goto LAB_00124b14;
  }
  pcVar16 = "VirtReg<Type=%u Id=%u>";
  if ((emitter == (CodeEmitter *)0x0) || (emitter->_type != '\x03')) goto LAB_00124b14;
  pcVar15 = (char *)(ulong)(regId - 0x100);
  pcVar1 = emitter[3]._inlineComment;
  if (pcVar1 <= pcVar15) {
LAB_00124b47:
    if (pcVar15 < pcVar1) {
      return in_EAX;
    }
LAB_00124b14:
    EVar3 = StringBuilder::appendFormat(sb,pcVar16,uVar12,uVar17);
    return EVar3;
  }
  if (regId == 0xffffffff) {
    X86Logging::formatRegister();
  }
  else {
    lVar4 = *(long *)(*(long *)&emitter[3]._globalOptions + (long)pcVar15 * 8);
    if (lVar4 != 0) {
      str = *(char **)(lVar4 + 8);
      if ((str == (char *)0x0) || (*str == '\0')) {
        in_EAX = StringBuilder::appendFormat(sb,"v%u",pcVar15);
      }
      else {
        in_EAX = StringBuilder::_opString(sb,1,str,0xffffffffffffffff);
      }
      goto LAB_00124b47;
    }
  }
  X86Logging::formatRegister();
  uVar11 = (uint)uVar6;
  if (0x59b < regType) {
    EVar3 = StringBuilder::appendFormat(sb,"<unknown id=#%u>",(ulong)regType);
    uVar12 = (ulong)EVar3;
    if (EVar3 != 0) {
      return EVar3;
    }
    goto LAB_00124e66;
  }
  if ((uVar6 & 0x40) == 0) {
LAB_00124bc0:
    if (((char)uVar6 < '\0') &&
       (EVar3 = StringBuilder::_opString(sb,1,"long ",0xffffffffffffffff), EVar3 != 0)) {
      uVar12 = (ulong)EVar3;
      goto LAB_00124e5c;
    }
    if (((uVar11 >> 0x10 & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"xacquire ",0xffffffffffffffff), EVar3 != 0)) {
      uVar12 = (ulong)EVar3;
      goto LAB_00124e5c;
    }
    if (((uVar11 >> 0x11 & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"xrelease ",0xffffffffffffffff), EVar3 != 0)) {
      uVar12 = (ulong)EVar3;
      goto LAB_00124e5c;
    }
    if (((uVar11 >> 0xd & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"lock ",0xffffffffffffffff), EVar3 != 0)) {
      uVar12 = (ulong)EVar3;
      goto LAB_00124e5c;
    }
    if ((uVar6 & 0xc000) != 0) {
      pcVar16 = "rep ";
      if ((uVar11 >> 0xe & 1) == 0) {
        pcVar16 = "repnz ";
      }
      StringBuilder::_opString(sb,1,pcVar16,0xffffffffffffffff);
      if ((undefined1  [16])((undefined1  [16])unaff_RBX->field_0 & (undefined1  [16])0x7) !=
          (undefined1  [16])0x0) {
        EVar3 = StringBuilder::_opChar(sb,1,'{');
        if (EVar3 == 0) {
          EVar3 = X86Logging::formatOperand(sb,logOptions,emitter_00,archType,unaff_RBX);
          if (EVar3 == 0) {
            EVar3 = StringBuilder::_opString(sb,1,"} ",0xffffffffffffffff);
            if (EVar3 == 0) goto LAB_00124d15;
            uVar12 = (ulong)EVar3;
          }
          else {
            uVar12 = (ulong)EVar3;
          }
        }
        else {
          uVar12 = (ulong)EVar3;
        }
        goto LAB_00124e5c;
      }
    }
LAB_00124d15:
    if ((int)uVar11 < 0) {
      if ((uVar6 & 0x1e000000) == 0) {
        EVar3 = StringBuilder::_opString(sb,1,"rex ",0xffffffffffffffff);
        bVar18 = EVar3 == 0;
        if (!bVar18) {
          uVar12 = (ulong)EVar3;
        }
      }
      else {
        StringBuilder::_opString(sb,1,"rex.",0xffffffffffffffff);
        if ((uVar11 >> 0x1b & 1) != 0) {
          StringBuilder::_opChar(sb,1,'r');
        }
        if ((uVar11 >> 0x1a & 1) != 0) {
          StringBuilder::_opChar(sb,1,'x');
        }
        if ((uVar11 >> 0x19 & 1) != 0) {
          StringBuilder::_opChar(sb,1,'b');
        }
        if ((uVar11 >> 0x1c & 1) != 0) {
          StringBuilder::_opChar(sb,1,'w');
        }
        StringBuilder::_opChar(sb,1,' ');
        bVar18 = true;
      }
      if (!bVar18) goto LAB_00124e5c;
    }
    if (((uVar11 >> 10 & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"vex3 ",0xffffffffffffffff), EVar3 != 0)) {
      uVar12 = (ulong)EVar3;
      goto LAB_00124e5c;
    }
    if (((uVar11 >> 0xc & 1) != 0) &&
       (EVar3 = StringBuilder::_opString(sb,1,"evex ",0xffffffffffffffff), EVar3 != 0)) {
      uVar12 = (ulong)EVar3;
      goto LAB_00124e5c;
    }
    EVar3 = StringBuilder::_opString
                      (sb,1,&X86InstDB::nameData +
                            (*(uint *)(X86InstDB::instData + (ulong)regType * 0xc) >> 8 & 0x3fff),
                       0xffffffffffffffff);
    bVar18 = EVar3 == 0;
    if (!bVar18) {
      uVar12 = (ulong)EVar3;
    }
  }
  else {
    EVar3 = StringBuilder::_opString(sb,1,"short ",0xffffffffffffffff);
    uVar12 = (ulong)EVar3;
    if (EVar3 == 0) goto LAB_00124bc0;
LAB_00124e5c:
    bVar18 = false;
  }
  if (!bVar18) {
    return (Error)uVar12;
  }
LAB_00124e66:
  if (unaff_R13D == 0) {
    EVar3 = 0;
  }
  else {
    uVar17 = 0;
    do {
      if ((*(byte *)(unaff_R12 + uVar17 * 0x10) & 7) == 0) {
        cVar2 = '\x1c';
        uVar6 = uVar12;
        goto LAB_00124f26;
      }
      pcVar16 = ", ";
      if (uVar17 == 0) {
        pcVar16 = " ";
      }
      cVar2 = '\x01';
      EVar3 = StringBuilder::_opString(sb,1,pcVar16,0xffffffffffffffff);
      if (EVar3 != 0) {
        uVar6 = (ulong)EVar3;
        goto LAB_00124f26;
      }
      op = (Operand_ *)(uVar17 * 0x10 + unaff_R12);
      EVar3 = X86Logging::formatOperand(sb,logOptions,emitter_00,archType,op);
      if (EVar3 != 0) {
        bVar18 = false;
        uVar12 = (ulong)EVar3;
        goto LAB_00124f28;
      }
      if (((logOptions & 2) == 0) || (((op->field_0)._any.signature & 7) != 3)) goto LAB_001253bc;
      lVar4 = 0;
      uVar6 = 0x10;
      do {
        uVar13 = *(uint *)(unaff_R12 + lVar4) >> 0x18;
        uVar8 = (ulong)uVar13;
        if (uVar13 < (uint)uVar6) {
          uVar8 = uVar6;
        }
        if ((*(uint *)(unaff_R12 + lVar4) & 7) != 1) {
          uVar8 = uVar6;
        }
        lVar4 = lVar4 + 0x10;
        uVar6 = uVar8;
      } while ((ulong)unaff_R13D << 4 != lVar4);
      uVar6 = 0;
      uVar5 = 0;
      uVar13 = (uint)*(byte *)((long)&op->field_0 + 8);
      uVar14 = (uint)uVar8;
      if ((int)regType < 0x41e) {
        if ((int)regType < 0x2b5) {
          if ((int)regType < 0x1d6) {
            if ((int)regType < 0x68) {
              if (regType == 0x22) goto switchD_00124fdf_caseD_455;
              uVar6 = uVar5;
              if (regType == 0x23) {
LAB_00125283:
                uVar7 = uVar14 >> 2;
                goto LAB_0012539d;
              }
            }
            else {
              uVar7 = regType - 0x68;
              if (uVar7 < 0x2f) {
                if ((0x1bUL >> ((ulong)uVar7 & 0x3f) & 1) != 0) {
                  uVar9 = 3;
LAB_001250c2:
                  advance = 0;
                  puVar10 = "eq_oq";
                  count = 1;
                  goto LAB_001251ae;
                }
                if ((0x600000000000U >> ((ulong)uVar7 & 0x3f) & 1) != 0)
                goto switchD_00124fdf_caseD_420;
              }
              if (regType == 0x1ae) {
LAB_00125338:
                uVar9 = uVar14 >> 3;
                if (3 < uVar14 >> 3) {
                  uVar9 = 4;
                }
                puVar10 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                          ::vmpsadbw;
                goto LAB_00125307;
              }
              uVar6 = uVar5;
              if (regType == 0x1d5) goto switchD_00124fdf_caseD_420;
            }
          }
          else {
            if ((int)regType < 0x27a) {
              if (2 < regType - 0x241) {
                if (regType == 0x1d6) goto switchD_00124fdf_caseD_427;
                uVar6 = uVar5;
                if (regType != 0x240) goto switchD_00124fdf_caseD_41f;
              }
              goto switchD_00124fdf_caseD_456;
            }
            if (regType - 0x27a < 4) goto switchD_0012507a_caseD_547;
            uVar6 = uVar5;
            if (regType == 0x2b4) goto switchD_0012507a_caseD_569;
          }
        }
        else if ((int)regType < 0x3a5) {
          if ((int)regType < 0x319) {
            if ((int)regType < 0x307) {
              if (regType == 0x2b5) goto switchD_0012507a_caseD_56a;
              if (regType == 0x2f5) goto switchD_00124fdf_caseD_455;
              uVar6 = uVar5;
              if (regType == 0x2f6) goto LAB_00125283;
            }
            else {
              uVar6 = uVar5;
              if (regType - 0x307 < 4) {
                uVar9 = 5;
                goto LAB_001250c2;
              }
            }
          }
          else {
            if (regType - 0x33e < 2) goto switchD_00124fdf_caseD_420;
            if (regType == 0x319) {
              puVar10 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                         ::vroundxx;
              goto LAB_00125236;
            }
            uVar6 = uVar5;
            if (regType == 0x339) goto switchD_00124fdf_caseD_456;
          }
        }
        else {
          if (regType - 0x3a5 < 4) {
            puVar10 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                       ::vfpclassxx;
LAB_00125236:
            uVar9 = 1;
            goto LAB_00125307;
          }
          if (regType - 0x3bd < 4) {
            puVar10 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                       ::vgetmantxx;
            goto LAB_0012513a;
          }
          uVar6 = uVar5;
          if (regType == 0x3fc) goto LAB_00125338;
        }
        goto switchD_00124fdf_caseD_41f;
      }
      if (0x4f9 < (int)regType) {
        switch(regType) {
        case 0x53f:
        case 0x540:
        case 0x541:
        case 0x542:
        case 0x543:
        case 0x544:
        case 0x545:
        case 0x546:
          puVar10 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                     ::vreducexx_vrndscalexx;
LAB_0012513a:
          uVar9 = 3;
          goto LAB_00125307;
        case 0x547:
        case 0x548:
        case 0x549:
        case 0x54a:
switchD_0012507a_caseD_547:
          puVar10 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                     ::vroundxx;
          goto LAB_00125302;
        case 0x54b:
        case 0x54c:
        case 0x54d:
        case 0x54e:
        case 0x54f:
        case 0x550:
        case 0x551:
        case 0x552:
        case 0x553:
        case 0x554:
        case 0x555:
        case 0x556:
        case 0x557:
        case 0x558:
        case 0x559:
        case 0x55a:
        case 0x55b:
        case 0x55c:
        case 0x55d:
        case 0x55e:
        case 0x55f:
        case 0x560:
        case 0x561:
        case 0x562:
        case 0x563:
        case 0x564:
          break;
        case 0x565:
        case 0x566:
        case 0x567:
        case 0x568:
          uVar7 = (uint)(uVar8 >> 4);
          if (uVar7 < 3) {
            uVar7 = 2;
          }
          uVar9 = 2 - (uVar14 < 0x30);
          goto LAB_001253a8;
        case 0x569:
switchD_0012507a_caseD_569:
          count = uVar14 >> 3;
          if (7 < uVar14 >> 3) {
            count = 8;
          }
          uVar9 = 1;
          advance = 2;
          puVar10 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                    ::vshufpd;
          goto LAB_001251ae;
        case 0x56a:
switchD_0012507a_caseD_56a:
          puVar10 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                    ::vshufps;
          goto LAB_001251a8;
        default:
          uVar8 = (ulong)(regType - 0x4fa);
          uVar6 = uVar5;
          if (regType - 0x4fa < 0x3b) {
            if ((0x780000000000000U >> (uVar8 & 0x3f) & 1) != 0) {
              puVar10 = &X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                         ::vrangexx;
              goto LAB_00125302;
            }
            if ((3UL >> (uVar8 & 0x3f) & 1) != 0) goto switchD_00124fdf_caseD_456;
            if ((0x600000000U >> (uVar8 & 0x3f) & 1) != 0) goto switchD_00124fdf_caseD_420;
          }
        }
        goto switchD_00124fdf_caseD_41f;
      }
      switch(regType) {
      case 0x41e:
        uVar7 = uVar14 >> 2;
        if (7 < uVar7) {
          uVar7 = 8;
        }
        goto LAB_0012539d;
      case 0x41f:
      case 0x421:
      case 0x422:
      case 0x423:
      case 0x424:
      case 0x425:
      case 0x426:
      case 0x428:
      case 0x42b:
      case 0x42c:
      case 0x42d:
      case 0x42e:
      case 0x42f:
      case 0x430:
      case 0x431:
      case 0x432:
      case 0x433:
      case 0x434:
      case 0x435:
      case 0x436:
      case 0x43f:
      case 0x440:
      case 0x447:
      case 0x448:
      case 1099:
      case 0x44c:
      case 0x44d:
      case 0x44e:
      case 0x44f:
      case 0x450:
      case 0x451:
      case 0x452:
      case 0x453:
      case 0x454:
      case 0x458:
        break;
      case 0x420:
switchD_00124fdf_caseD_420:
        uVar9 = 1;
        uVar7 = 8;
        goto LAB_001253a8;
      case 0x427:
switchD_00124fdf_caseD_427:
        puVar10 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                  ::vpclmulqdq;
        goto LAB_00125302;
      case 0x429:
      case 0x42a:
      case 0x437:
      case 0x438:
      case 0x439:
      case 0x43a:
      case 0x43b:
      case 0x43c:
        puVar10 = "eq";
        goto LAB_001251a8;
      case 0x43d:
      case 0x43e:
      case 0x441:
      case 0x442:
      case 0x443:
      case 0x444:
      case 0x445:
      case 0x446:
        puVar10 = "lt";
LAB_001251a8:
        uVar9 = 2;
        advance = 4;
        count = 4;
LAB_001251ae:
        EVar3 = X86Logging_formatImmText(sb,uVar13,uVar9,advance,puVar10,count);
        uVar6 = (ulong)EVar3;
        break;
      case 0x449:
      case 0x44a:
        puVar10 = X86Logging_formatImmExtended(asmjit::StringBuilder&,unsigned_int,unsigned_int,unsigned_int,asmjit::Imm_const&)
                  ::vperm2x128;
LAB_00125302:
        uVar9 = 2;
LAB_00125307:
        EVar3 = X86Logging_formatImmBits(sb,uVar13,(ImmBits *)puVar10,uVar9);
        uVar6 = (ulong)EVar3;
        break;
      case 0x455:
switchD_00124fdf_caseD_455:
        uVar7 = uVar14 >> 3;
LAB_0012539d:
        uVar9 = 1;
        goto LAB_001253a8;
      case 0x456:
      case 0x457:
      case 0x459:
switchD_00124fdf_caseD_456:
        uVar9 = 2;
        uVar7 = 4;
LAB_001253a8:
        EVar3 = X86Logging_formatImmShuf(sb,uVar13,uVar9,uVar7);
        uVar6 = (ulong)EVar3;
        break;
      default:
        if (regType == 0x4f9) goto switchD_00124fdf_caseD_456;
      }
switchD_00124fdf_caseD_41f:
      if ((int)uVar6 == 0) {
LAB_001253bc:
        if (uVar17 == 0) {
          if ((unaff_RBX->field_0)._any.signature == 0x391) {
            cVar2 = '\x01';
            EVar3 = StringBuilder::_opString(sb,1," {",0xffffffffffffffff);
            if (EVar3 == 0) {
              EVar3 = X86Logging::formatOperand(sb,logOptions,emitter_00,archType,unaff_RBX);
              if (EVar3 == 0) {
                cVar2 = '\x01';
                EVar3 = StringBuilder::_opChar(sb,1,'}');
                if (EVar3 == 0) {
                  if ((uVar11 >> 0x17 & 1) != 0) {
                    pcVar16 = "{z}";
                    goto LAB_001254ea;
                  }
                  goto LAB_001253c1;
                }
                uVar6 = (ulong)EVar3;
              }
              else {
                uVar6 = (ulong)EVar3;
              }
            }
            else {
              uVar6 = (ulong)EVar3;
            }
            goto LAB_00124f26;
          }
          if ((uVar11 >> 0x17 & 1) != 0) {
            pcVar16 = " {z}";
LAB_001254ea:
            cVar2 = '\x01';
            EVar3 = StringBuilder::_opString(sb,1,pcVar16,0xffffffffffffffff);
            if (EVar3 != 0) {
              uVar6 = (ulong)EVar3;
              goto LAB_00124f26;
            }
          }
        }
LAB_001253c1:
        cVar2 = '\0';
        bVar18 = true;
        if (((uVar11 >> 0x14 & 1) != 0) && (((op->field_0)._any.signature & 7) == 2)) {
          EVar3 = StringBuilder::_opString(sb,1," {1tox}",0xffffffffffffffff);
          bVar18 = EVar3 == 0;
          cVar2 = !bVar18;
          if (!bVar18) {
            uVar12 = (ulong)EVar3;
          }
        }
      }
      else {
LAB_00124f26:
        bVar18 = false;
        uVar12 = uVar6;
      }
LAB_00124f28:
      EVar3 = (Error)uVar12;
      if (!bVar18) goto LAB_00125525;
      uVar17 = uVar17 + 1;
    } while (uVar17 != unaff_R13D);
    cVar2 = '\x1c';
LAB_00125525:
    if (cVar2 == '\x1c') {
      EVar3 = 0;
    }
  }
  return EVar3;
}

Assistant:

Error Logging::formatRegister(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  uint32_t regType,
  uint32_t regId) noexcept {

#if defined(ASMJIT_BUILD_X86)
  return X86Logging::formatRegister(sb, logOptions, emitter, archType, regType, regId);
#endif // ASMJIT_BUILD_X86

#if defined(ASMJIT_BUILD_ARM)
  return ArmLogging::formatRegister(sb, logOptions, emitter, archType, regType, regId);
#endif // ASMJIT_BUILD_ARM

  return kErrorInvalidArch;
}